

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

uchar ** tinyexr::AllocateImage
                   (int num_channels,EXRChannelInfo *channels,int *requested_pixel_types,
                   int data_width,int data_height)

{
  size_t sVar1;
  int iVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  long lVar5;
  size_t __size;
  int *piVar6;
  
  ppuVar3 = (uchar **)malloc((long)num_channels * 8);
  if (num_channels != 0) {
    sVar1 = (long)data_height * (long)data_width * 4;
    piVar6 = &channels->pixel_type;
    lVar5 = 0;
    do {
      iVar2 = *piVar6;
      __size = sVar1;
      if (((iVar2 == 0) || (iVar2 == 2)) ||
         ((iVar2 == 1 &&
          ((__size = (long)data_height * (long)data_width * 2, requested_pixel_types[lVar5] == 1 ||
           (__size = sVar1, requested_pixel_types[lVar5] == 2)))))) {
        puVar4 = (uchar *)malloc(__size);
        ppuVar3[lVar5] = puVar4;
      }
      lVar5 = lVar5 + 1;
      piVar6 = piVar6 + 0x44;
    } while (num_channels != lVar5);
  }
  return ppuVar3;
}

Assistant:

static unsigned char **AllocateImage(int num_channels,
                                     const EXRChannelInfo *channels,
                                     const int *requested_pixel_types,
                                     int data_width, int data_height) {
  unsigned char **images =
      reinterpret_cast<unsigned char **>(static_cast<float **>(
          malloc(sizeof(float *) * static_cast<size_t>(num_channels))));

  for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
    size_t data_len =
        static_cast<size_t>(data_width) * static_cast<size_t>(data_height);
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      // pixel_data_size += sizeof(unsigned short);
      // channel_offset += sizeof(unsigned short);
      // Alloc internal image for half type.
      if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
        images[c] =
            reinterpret_cast<unsigned char *>(static_cast<unsigned short *>(
                malloc(sizeof(unsigned short) * data_len)));
      } else if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
        images[c] = reinterpret_cast<unsigned char *>(
            static_cast<float *>(malloc(sizeof(float) * data_len)));
      } else {
        assert(0);
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      // pixel_data_size += sizeof(float);
      // channel_offset += sizeof(float);
      images[c] = reinterpret_cast<unsigned char *>(
          static_cast<float *>(malloc(sizeof(float) * data_len)));
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      // pixel_data_size += sizeof(unsigned int);
      // channel_offset += sizeof(unsigned int);
      images[c] = reinterpret_cast<unsigned char *>(
          static_cast<unsigned int *>(malloc(sizeof(unsigned int) * data_len)));
    } else {
      assert(0);
    }
  }

  return images;
}